

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::isPattern(Lexer *this,string *token,Type *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  string word;
  string local_70;
  string local_50;
  
  if (this->_enablePattern != true) {
    return false;
  }
  sVar2 = this->_cursor;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
  bVar3 = readWord(&this->_text,&local_70,&this->_cursor,&local_50);
  if (bVar3) {
    if (this->_cursor < this->_eos) {
      bVar3 = unicodeWhitespace((int)(this->_text)._M_dataplus._M_p[this->_cursor]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_001059db;
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    std::__cxx11::string::operator=((string *)token,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    *type = pattern;
    bVar3 = false;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_001059db:
    this->_cursor = sVar2;
    bVar3 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (bVar3) {
    return false;
  }
  return true;
}

Assistant:

bool Lexer::isPattern (std::string& token, Lexer::Type& type)
{
  if (_enablePattern)
  {
    std::size_t marker = _cursor;

    std::string word;
    if (readWord (_text, "/", _cursor, word) &&
        (isEOS () ||
         unicodeWhitespace (_text[_cursor])))
    {
      token = _text.substr (marker, _cursor - marker);
      type = Lexer::Type::pattern;
      return true;
    }

    _cursor = marker;
  }

  return false;
}